

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_console_outputter.hpp
# Opt level: O1

void __thiscall
hayai::ConsoleOutputter::EndTest
          (ConsoleOutputter *this,string *fixtureName,string *testName,
          TestParametersDescriptor *parameters,TestResult *result)

{
  uint64_t uVar1;
  uint64_t uVar2;
  size_t sVar3;
  ConsoleOutputter *pCVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  double dVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  TextColor local_60 [2];
  TestParametersDescriptor *local_58;
  double dStack_50;
  ConsoleOutputter *local_40;
  TextColor local_38 [2];
  
  local_60[0] = TextGreen;
  local_58 = parameters;
  poVar5 = operator<<(this->_stream,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[     DONE ]",0xc);
  local_60[1] = 7;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  Outputter::WriteTestNameToStream(this->_stream,fixtureName,testName,local_58);
  local_60[0] = TextDefault;
  poVar5 = operator<<(this->_stream,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 6;
  auVar65._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar65._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar65._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((auVar65._8_8_ - 1.9342813113834067e+25) +
                      (auVar65._0_8_ - 4503599627370496.0)) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ms)",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_60[0] = TextBlue;
  local_40 = this;
  poVar5 = operator<<(this->_stream,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[   RUNS   ] ",0xd);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"       Average time: ",0x15);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 3;
  uVar1 = result->_timeTotal;
  auVar66._8_4_ = (int)(uVar1 >> 0x20);
  auVar66._0_8_ = uVar1;
  auVar66._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar67._8_4_ = (int)(lVar6 >> 0x23);
  auVar67._0_8_ = lVar7;
  auVar67._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     ((((auVar66._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar67._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," us ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
  local_38[1] = 2;
  poVar5 = operator<<(poVar5,local_38 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"~",1);
  poVar5 = std::ostream::_M_insert<double>(result->_timeStdDev / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," us",3);
  local_38[0] = TextDefault;
  poVar5 = operator<<(poVar5,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar1 = result->_timeRunMin;
  auVar10._8_4_ = (int)(uVar1 >> 0x20);
  auVar10._0_8_ = uVar1;
  auVar10._12_4_ = 0x45300000;
  dStack_50 = auVar10._8_8_ - 1.9342813113834067e+25;
  uVar2 = result->_timeTotal;
  auVar11._8_4_ = (int)(uVar2 >> 0x20);
  auVar11._0_8_ = uVar2;
  auVar11._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar12._8_4_ = (int)(lVar6 >> 0x23);
  auVar12._0_8_ = lVar7;
  auVar12._12_4_ = 0x45300000;
  local_58 = (TestParametersDescriptor *)
             ((dStack_50 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1000.0
             - (((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0);
  poVar5 = this->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Fastest time: ",0xe);
  auVar68._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeRunMin);
  auVar68._8_4_ = (int)(result->_timeRunMin >> 0x20);
  auVar68._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((auVar68._8_8_ - 1.9342813113834067e+25) +
                      (auVar68._0_8_ - 4503599627370496.0)) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  uVar1 = result->_timeRunMin;
  auVar69._8_4_ = (int)(uVar1 >> 0x20);
  auVar69._0_8_ = uVar1;
  auVar69._12_4_ = 0x45300000;
  uVar2 = result->_timeTotal;
  auVar70._8_4_ = (int)(uVar2 >> 0x20);
  auVar70._0_8_ = uVar2;
  auVar70._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar71._8_4_ = (int)(lVar6 >> 0x23);
  auVar71._0_8_ = lVar7;
  auVar71._12_4_ = 0x45300000;
  local_60[0] = (uint)((((auVar70._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                       ((auVar71._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0 <
                      ((auVar69._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1000.0) * 2
                + TextGreen;
  poVar5 = operator<<(poVar5,local_60);
  uVar1 = result->_timeRunMin;
  auVar72._8_4_ = (int)(uVar1 >> 0x20);
  auVar72._0_8_ = uVar1;
  auVar72._12_4_ = 0x45300000;
  dVar9 = ((auVar72._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1000.0;
  uVar1 = result->_timeTotal;
  auVar73._8_4_ = (int)(uVar1 >> 0x20);
  auVar73._0_8_ = uVar1;
  auVar73._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar74._8_4_ = (int)(lVar6 >> 0x23);
  auVar74._0_8_ = lVar7;
  auVar74._12_4_ = 0x45300000;
  dVar146 = (((auVar73._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
            ((auVar74._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0;
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  poVar5 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
  uVar1 = result->_timeRunMin;
  auVar75._8_4_ = (int)(uVar1 >> 0x20);
  auVar75._0_8_ = uVar1;
  auVar75._12_4_ = 0x45300000;
  dVar9 = ((auVar75._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1000.0;
  uVar1 = result->_timeTotal;
  auVar76._8_4_ = (int)(uVar1 >> 0x20);
  auVar76._0_8_ = uVar1;
  auVar76._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar77._8_4_ = (int)(lVar6 >> 0x23);
  auVar77._0_8_ = lVar7;
  auVar77._12_4_ = 0x45300000;
  dVar146 = (((auVar76._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
            ((auVar77._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0;
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  uVar1 = result->_timeTotal;
  auVar13._8_4_ = (int)(uVar1 >> 0x20);
  auVar13._0_8_ = uVar1;
  auVar13._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar14._8_4_ = (int)(lVar6 >> 0x23);
  auVar14._0_8_ = lVar7;
  auVar14._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      ((((auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar14._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," %",2);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar1 = result->_timeRunMax;
  auVar15._8_4_ = (int)(uVar1 >> 0x20);
  auVar15._0_8_ = uVar1;
  auVar15._12_4_ = 0x45300000;
  dStack_50 = auVar15._8_8_ - 1.9342813113834067e+25;
  uVar2 = result->_timeTotal;
  auVar16._8_4_ = (int)(uVar2 >> 0x20);
  auVar16._0_8_ = uVar2;
  auVar16._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar17._8_4_ = (int)(lVar6 >> 0x23);
  auVar17._0_8_ = lVar7;
  auVar17._12_4_ = 0x45300000;
  local_58 = (TestParametersDescriptor *)
             ((dStack_50 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1000.0
             - (((auVar16._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
               ((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0);
  poVar5 = local_40->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Slowest time: ",0xe);
  auVar78._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeRunMax);
  auVar78._8_4_ = (int)(result->_timeRunMax >> 0x20);
  auVar78._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((auVar78._8_8_ - 1.9342813113834067e+25) +
                      (auVar78._0_8_ - 4503599627370496.0)) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  uVar1 = result->_timeRunMax;
  auVar79._8_4_ = (int)(uVar1 >> 0x20);
  auVar79._0_8_ = uVar1;
  auVar79._12_4_ = 0x45300000;
  uVar2 = result->_timeTotal;
  auVar80._8_4_ = (int)(uVar2 >> 0x20);
  auVar80._0_8_ = uVar2;
  auVar80._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar81._8_4_ = (int)(lVar6 >> 0x23);
  auVar81._0_8_ = lVar7;
  auVar81._12_4_ = 0x45300000;
  local_60[0] = (uint)((((auVar80._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                       ((auVar81._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0 <
                      ((auVar79._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1000.0) * 2
                + TextGreen;
  poVar5 = operator<<(poVar5,local_60);
  uVar1 = result->_timeRunMax;
  auVar82._8_4_ = (int)(uVar1 >> 0x20);
  auVar82._0_8_ = uVar1;
  auVar82._12_4_ = 0x45300000;
  dVar9 = ((auVar82._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1000.0;
  uVar1 = result->_timeTotal;
  auVar83._8_4_ = (int)(uVar1 >> 0x20);
  auVar83._0_8_ = uVar1;
  auVar83._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar84._8_4_ = (int)(lVar6 >> 0x23);
  auVar84._0_8_ = lVar7;
  auVar84._12_4_ = 0x45300000;
  dVar146 = (((auVar83._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
            ((auVar84._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0;
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  poVar5 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
  uVar1 = result->_timeRunMax;
  auVar85._8_4_ = (int)(uVar1 >> 0x20);
  auVar85._0_8_ = uVar1;
  auVar85._12_4_ = 0x45300000;
  dVar9 = ((auVar85._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1000.0;
  uVar1 = result->_timeTotal;
  auVar86._8_4_ = (int)(uVar1 >> 0x20);
  auVar86._0_8_ = uVar1;
  auVar86._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar87._8_4_ = (int)(lVar6 >> 0x23);
  auVar87._0_8_ = lVar7;
  auVar87._12_4_ = 0x45300000;
  dVar146 = (((auVar86._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
            ((auVar87._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0;
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  uVar1 = result->_timeTotal;
  auVar18._8_4_ = (int)(uVar1 >> 0x20);
  auVar18._0_8_ = uVar1;
  auVar18._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar19._8_4_ = (int)(lVar6 >> 0x23);
  auVar19._0_8_ = lVar7;
  auVar19._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      ((((auVar18._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar19._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / 1000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," %",2);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pCVar4 = local_40;
  poVar5 = local_40->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Median time: ",0xd);
  poVar5 = std::ostream::_M_insert<double>(result->_timeMedian / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," us (",5);
  local_60[0] = TextCyan;
  poVar5 = operator<<(poVar5,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"1st quartile: ",0xe);
  poVar5 = std::ostream::_M_insert<double>(result->_timeQuartile1 / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," us | 3rd quartile: ",0x14);
  poVar5 = std::ostream::_M_insert<double>(result->_timeQuartile3 / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," us",3);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = pCVar4->_stream;
  lVar6 = *(long *)poVar5;
  *(undefined8 *)(poVar5 + *(long *)(lVar6 + -0x18) + 8) = 5;
  *(undefined8 *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"",0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = pCVar4->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Average performance: ",0x15);
  uVar1 = result->_timeTotal;
  auVar20._8_4_ = (int)(uVar1 >> 0x20);
  auVar20._0_8_ = uVar1;
  auVar20._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar21._8_4_ = (int)(lVar6 >> 0x23);
  auVar21._0_8_ = lVar7;
  auVar21._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (((auVar20._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar21._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," runs/s",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar1 = result->_timeRunMin;
  auVar22._8_4_ = (int)(uVar1 >> 0x20);
  auVar22._0_8_ = uVar1;
  auVar22._12_4_ = 0x45300000;
  uVar2 = result->_timeTotal;
  auVar23._8_4_ = (int)(uVar2 >> 0x20);
  auVar23._0_8_ = uVar2;
  auVar23._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar24._8_4_ = (int)(lVar6 >> 0x23);
  auVar24._0_8_ = lVar7;
  auVar24._12_4_ = 0x45300000;
  local_58 = (TestParametersDescriptor *)
             (1000000000.0 /
              ((auVar22._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
             1000000000.0 /
             (((auVar23._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
             ((auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))));
  poVar5 = pCVar4->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Best performance: ",0x12);
  auVar25._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeRunMin);
  auVar25._8_4_ = (int)(result->_timeRunMin >> 0x20);
  auVar25._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      ((auVar25._8_8_ - 1.9342813113834067e+25) +
                      (auVar25._0_8_ - 4503599627370496.0)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"runs/s",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  uVar1 = result->_timeRunMin;
  auVar26._8_4_ = (int)(uVar1 >> 0x20);
  auVar26._0_8_ = uVar1;
  auVar26._12_4_ = 0x45300000;
  uVar2 = result->_timeTotal;
  auVar88._8_4_ = (int)(uVar2 >> 0x20);
  auVar88._0_8_ = uVar2;
  auVar88._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar89._8_4_ = (int)(lVar6 >> 0x23);
  auVar89._0_8_ = lVar7;
  auVar89._12_4_ = 0x45300000;
  local_60[0] = (uint)(1000000000.0 /
                       ((auVar26._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) <
                      1000000000.0 /
                      (((auVar88._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                      ((auVar89._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)))) * 2 +
                TextGreen;
  poVar5 = operator<<(poVar5,local_60);
  uVar1 = result->_timeRunMin;
  auVar27._8_4_ = (int)(uVar1 >> 0x20);
  auVar27._0_8_ = uVar1;
  auVar27._12_4_ = 0x45300000;
  dVar9 = 1000000000.0 /
          ((auVar27._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  uVar1 = result->_timeTotal;
  auVar90._8_4_ = (int)(uVar1 >> 0x20);
  auVar90._0_8_ = uVar1;
  auVar90._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar91._8_4_ = (int)(lVar6 >> 0x23);
  auVar91._0_8_ = lVar7;
  auVar91._12_4_ = 0x45300000;
  dVar146 = 1000000000.0 /
            (((auVar90._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
            ((auVar91._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)));
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  poVar5 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"runs/s",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
  uVar1 = result->_timeRunMin;
  auVar28._8_4_ = (int)(uVar1 >> 0x20);
  auVar28._0_8_ = uVar1;
  auVar28._12_4_ = 0x45300000;
  dVar9 = 1000000000.0 /
          ((auVar28._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  uVar1 = result->_timeTotal;
  auVar92._8_4_ = (int)(uVar1 >> 0x20);
  auVar92._0_8_ = uVar1;
  auVar92._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar93._8_4_ = (int)(lVar6 >> 0x23);
  auVar93._0_8_ = lVar7;
  auVar93._12_4_ = 0x45300000;
  dVar146 = 1000000000.0 /
            (((auVar92._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
            ((auVar93._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)));
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  uVar1 = result->_timeTotal;
  auVar29._8_4_ = (int)(uVar1 >> 0x20);
  auVar29._0_8_ = uVar1;
  auVar29._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar30._8_4_ = (int)(lVar6 >> 0x23);
  auVar30._0_8_ = lVar7;
  auVar30._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (1000000000.0 /
                      (((auVar29._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar30._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," %",2);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar1 = result->_timeRunMax;
  auVar31._8_4_ = (int)(uVar1 >> 0x20);
  auVar31._0_8_ = uVar1;
  auVar31._12_4_ = 0x45300000;
  uVar2 = result->_timeTotal;
  auVar32._8_4_ = (int)(uVar2 >> 0x20);
  auVar32._0_8_ = uVar2;
  auVar32._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar33._8_4_ = (int)(lVar6 >> 0x23);
  auVar33._0_8_ = lVar7;
  auVar33._12_4_ = 0x45300000;
  local_58 = (TestParametersDescriptor *)
             (1000000000.0 /
              ((auVar31._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
             1000000000.0 /
             (((auVar32._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
             ((auVar33._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))));
  poVar5 = local_40->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Worst performance: ",0x13);
  auVar34._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeRunMax);
  auVar34._8_4_ = (int)(result->_timeRunMax >> 0x20);
  auVar34._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      ((auVar34._8_8_ - 1.9342813113834067e+25) +
                      (auVar34._0_8_ - 4503599627370496.0)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"runs/s",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  uVar1 = result->_timeRunMax;
  auVar35._8_4_ = (int)(uVar1 >> 0x20);
  auVar35._0_8_ = uVar1;
  auVar35._12_4_ = 0x45300000;
  uVar2 = result->_timeTotal;
  auVar94._8_4_ = (int)(uVar2 >> 0x20);
  auVar94._0_8_ = uVar2;
  auVar94._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar95._8_4_ = (int)(lVar6 >> 0x23);
  auVar95._0_8_ = lVar7;
  auVar95._12_4_ = 0x45300000;
  local_60[0] = (uint)(1000000000.0 /
                       ((auVar35._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) <
                      1000000000.0 /
                      (((auVar94._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                      ((auVar95._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)))) * 2 +
                TextGreen;
  poVar5 = operator<<(poVar5,local_60);
  uVar1 = result->_timeRunMax;
  auVar36._8_4_ = (int)(uVar1 >> 0x20);
  auVar36._0_8_ = uVar1;
  auVar36._12_4_ = 0x45300000;
  dVar9 = 1000000000.0 /
          ((auVar36._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  uVar1 = result->_timeTotal;
  auVar96._8_4_ = (int)(uVar1 >> 0x20);
  auVar96._0_8_ = uVar1;
  auVar96._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar97._8_4_ = (int)(lVar6 >> 0x23);
  auVar97._0_8_ = lVar7;
  auVar97._12_4_ = 0x45300000;
  dVar146 = 1000000000.0 /
            (((auVar96._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
            ((auVar97._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)));
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  poVar5 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"runs/s",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
  uVar1 = result->_timeRunMax;
  auVar37._8_4_ = (int)(uVar1 >> 0x20);
  auVar37._0_8_ = uVar1;
  auVar37._12_4_ = 0x45300000;
  dVar9 = 1000000000.0 /
          ((auVar37._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  uVar1 = result->_timeTotal;
  auVar98._8_4_ = (int)(uVar1 >> 0x20);
  auVar98._0_8_ = uVar1;
  auVar98._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar99._8_4_ = (int)(lVar6 >> 0x23);
  auVar99._0_8_ = lVar7;
  auVar99._12_4_ = 0x45300000;
  dVar146 = 1000000000.0 /
            (((auVar98._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
            ((auVar99._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)));
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  uVar1 = result->_timeTotal;
  auVar38._8_4_ = (int)(uVar1 >> 0x20);
  auVar38._0_8_ = uVar1;
  auVar38._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar39._8_4_ = (int)(lVar6 >> 0x23);
  auVar39._0_8_ = lVar7;
  auVar39._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (1000000000.0 /
                      (((auVar38._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar39._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," %",2);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pCVar4 = local_40;
  poVar5 = local_40->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Median performance: ",0x14);
  poVar5 = std::ostream::_M_insert<double>(1000000000.0 / result->_timeMedian);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," runs/s (",9);
  local_60[0] = TextCyan;
  poVar5 = operator<<(poVar5,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"1st quartile: ",0xe);
  poVar5 = std::ostream::_M_insert<double>(1000000000.0 / result->_timeQuartile1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," | 3rd quartile: ",0x11);
  poVar5 = std::ostream::_M_insert<double>(1000000000.0 / result->_timeQuartile3);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = pCVar4->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"",0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_60[0] = TextBlue;
  poVar5 = operator<<(pCVar4->_stream,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[ITERATIONS] ",0xd);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 3;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"       Average time: ",0x15);
  uVar1 = result->_timeTotal;
  auVar100._8_4_ = (int)(uVar1 >> 0x20);
  auVar100._0_8_ = uVar1;
  auVar100._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar101._8_4_ = (int)(lVar6 >> 0x23);
  auVar101._0_8_ = lVar7;
  auVar101._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar102._8_4_ = (int)(sVar3 >> 0x20);
  auVar102._0_8_ = sVar3;
  auVar102._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((((auVar100._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar101._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) /
                      ((auVar102._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," us ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
  local_38[1] = 2;
  poVar5 = operator<<(poVar5,local_38 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"~",1);
  auVar103._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar103._8_4_ = (int)(result->_iterations >> 0x20);
  auVar103._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     ((result->_timeStdDev /
                      ((auVar103._8_8_ - 1.9342813113834067e+25) +
                      (auVar103._0_8_ - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," us",3);
  local_38[0] = TextDefault;
  poVar5 = operator<<(poVar5,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar1 = result->_timeRunMin;
  auVar40._8_4_ = (int)(uVar1 >> 0x20);
  auVar40._0_8_ = uVar1;
  auVar40._12_4_ = 0x45300000;
  dStack_50 = auVar40._8_8_ - 1.9342813113834067e+25;
  sVar3 = result->_iterations;
  auVar104._8_4_ = (int)(sVar3 >> 0x20);
  auVar104._0_8_ = sVar3;
  auVar104._12_4_ = 0x45300000;
  dVar9 = (auVar104._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  uVar2 = result->_timeTotal;
  auVar105._8_4_ = (int)(uVar2 >> 0x20);
  auVar105._0_8_ = uVar2;
  auVar105._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar106._8_4_ = (int)(lVar6 >> 0x23);
  auVar106._0_8_ = lVar7;
  auVar106._12_4_ = 0x45300000;
  local_58 = (TestParametersDescriptor *)
             (((dStack_50 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar9)
              / 1000.0 -
             ((((auVar105._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
              ((auVar106._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9) / 1000.0);
  poVar5 = pCVar4->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Fastest time: ",0xe);
  uVar1 = result->_timeRunMin;
  auVar107._8_4_ = (int)(uVar1 >> 0x20);
  auVar107._0_8_ = uVar1;
  auVar107._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar108._8_4_ = (int)(sVar3 >> 0x20);
  auVar108._0_8_ = sVar3;
  auVar108._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     ((((auVar107._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar108._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  uVar1 = result->_timeRunMin;
  auVar109._8_4_ = (int)(uVar1 >> 0x20);
  auVar109._0_8_ = uVar1;
  auVar109._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar147._8_4_ = (int)(sVar3 >> 0x20);
  auVar147._0_8_ = sVar3;
  auVar147._12_4_ = 0x45300000;
  dVar9 = (auVar147._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  uVar2 = result->_timeTotal;
  auVar148._8_4_ = (int)(uVar2 >> 0x20);
  auVar148._0_8_ = uVar2;
  auVar148._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar149._8_4_ = (int)(lVar6 >> 0x23);
  auVar149._0_8_ = lVar7;
  auVar149._12_4_ = 0x45300000;
  local_60[0] = (uint)(((((auVar148._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                        ((auVar149._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9) /
                       1000.0 < (((auVar109._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                                dVar9) / 1000.0) * 2 + TextGreen;
  poVar5 = operator<<(poVar5,local_60);
  uVar1 = result->_timeRunMin;
  auVar110._8_4_ = (int)(uVar1 >> 0x20);
  auVar110._0_8_ = uVar1;
  auVar110._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar150._8_4_ = (int)(sVar3 >> 0x20);
  auVar150._0_8_ = sVar3;
  auVar150._12_4_ = 0x45300000;
  dVar146 = (auVar150._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  dVar9 = (((auVar110._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar146) / 1000.0;
  uVar1 = result->_timeTotal;
  auVar151._8_4_ = (int)(uVar1 >> 0x20);
  auVar151._0_8_ = uVar1;
  auVar151._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar152._8_4_ = (int)(lVar6 >> 0x23);
  auVar152._0_8_ = lVar7;
  auVar152._12_4_ = 0x45300000;
  dVar146 = ((((auVar151._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
             ((auVar152._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar146) / 1000.0;
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  poVar5 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
  uVar1 = result->_timeRunMin;
  auVar111._8_4_ = (int)(uVar1 >> 0x20);
  auVar111._0_8_ = uVar1;
  auVar111._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar153._8_4_ = (int)(sVar3 >> 0x20);
  auVar153._0_8_ = sVar3;
  auVar153._12_4_ = 0x45300000;
  dVar146 = (auVar153._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  dVar9 = (((auVar111._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar146) / 1000.0;
  uVar1 = result->_timeTotal;
  auVar154._8_4_ = (int)(uVar1 >> 0x20);
  auVar154._0_8_ = uVar1;
  auVar154._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar155._8_4_ = (int)(lVar6 >> 0x23);
  auVar155._0_8_ = lVar7;
  auVar155._12_4_ = 0x45300000;
  dVar146 = ((((auVar154._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
             ((auVar155._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar146) / 1000.0;
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  uVar1 = result->_timeTotal;
  auVar112._8_4_ = (int)(uVar1 >> 0x20);
  auVar112._0_8_ = uVar1;
  auVar112._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar113._8_4_ = (int)(lVar6 >> 0x23);
  auVar113._0_8_ = lVar7;
  auVar113._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar114._8_4_ = (int)(sVar3 >> 0x20);
  auVar114._0_8_ = sVar3;
  auVar114._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (((((auVar112._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                        ((auVar113._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) /
                       ((auVar114._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) / 1000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," %",2);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar1 = result->_timeRunMax;
  auVar41._8_4_ = (int)(uVar1 >> 0x20);
  auVar41._0_8_ = uVar1;
  auVar41._12_4_ = 0x45300000;
  dStack_50 = auVar41._8_8_ - 1.9342813113834067e+25;
  sVar3 = result->_iterations;
  auVar115._8_4_ = (int)(sVar3 >> 0x20);
  auVar115._0_8_ = sVar3;
  auVar115._12_4_ = 0x45300000;
  dVar9 = (auVar115._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  uVar2 = result->_timeTotal;
  auVar116._8_4_ = (int)(uVar2 >> 0x20);
  auVar116._0_8_ = uVar2;
  auVar116._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar117._8_4_ = (int)(lVar6 >> 0x23);
  auVar117._0_8_ = lVar7;
  auVar117._12_4_ = 0x45300000;
  local_58 = (TestParametersDescriptor *)
             (((dStack_50 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar9)
              / 1000.0 -
             ((((auVar116._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
              ((auVar117._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9) / 1000.0);
  poVar5 = local_40->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Slowest time: ",0xe);
  uVar1 = result->_timeRunMax;
  auVar118._8_4_ = (int)(uVar1 >> 0x20);
  auVar118._0_8_ = uVar1;
  auVar118._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar119._8_4_ = (int)(sVar3 >> 0x20);
  auVar119._0_8_ = sVar3;
  auVar119._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     ((((auVar118._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar119._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  uVar1 = result->_timeRunMax;
  auVar120._8_4_ = (int)(uVar1 >> 0x20);
  auVar120._0_8_ = uVar1;
  auVar120._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar156._8_4_ = (int)(sVar3 >> 0x20);
  auVar156._0_8_ = sVar3;
  auVar156._12_4_ = 0x45300000;
  dVar9 = (auVar156._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  uVar2 = result->_timeTotal;
  auVar157._8_4_ = (int)(uVar2 >> 0x20);
  auVar157._0_8_ = uVar2;
  auVar157._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar158._8_4_ = (int)(lVar6 >> 0x23);
  auVar158._0_8_ = lVar7;
  auVar158._12_4_ = 0x45300000;
  local_60[0] = (uint)(((((auVar157._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                        ((auVar158._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9) /
                       1000.0 < (((auVar120._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                                dVar9) / 1000.0) * 2 + TextGreen;
  poVar5 = operator<<(poVar5,local_60);
  uVar1 = result->_timeRunMax;
  auVar121._8_4_ = (int)(uVar1 >> 0x20);
  auVar121._0_8_ = uVar1;
  auVar121._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar159._8_4_ = (int)(sVar3 >> 0x20);
  auVar159._0_8_ = sVar3;
  auVar159._12_4_ = 0x45300000;
  dVar146 = (auVar159._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  dVar9 = (((auVar121._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar146) / 1000.0;
  uVar1 = result->_timeTotal;
  auVar160._8_4_ = (int)(uVar1 >> 0x20);
  auVar160._0_8_ = uVar1;
  auVar160._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar161._8_4_ = (int)(lVar6 >> 0x23);
  auVar161._0_8_ = lVar7;
  auVar161._12_4_ = 0x45300000;
  dVar146 = ((((auVar160._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
             ((auVar161._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar146) / 1000.0;
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  poVar5 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
  uVar1 = result->_timeRunMax;
  auVar122._8_4_ = (int)(uVar1 >> 0x20);
  auVar122._0_8_ = uVar1;
  auVar122._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar162._8_4_ = (int)(sVar3 >> 0x20);
  auVar162._0_8_ = sVar3;
  auVar162._12_4_ = 0x45300000;
  dVar146 = (auVar162._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  dVar9 = (((auVar122._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar146) / 1000.0;
  uVar1 = result->_timeTotal;
  auVar163._8_4_ = (int)(uVar1 >> 0x20);
  auVar163._0_8_ = uVar1;
  auVar163._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar164._8_4_ = (int)(lVar6 >> 0x23);
  auVar164._0_8_ = lVar7;
  auVar164._12_4_ = 0x45300000;
  dVar146 = ((((auVar163._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
             ((auVar164._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar146) / 1000.0;
  pcVar8 = "";
  if (dVar146 < dVar9) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar146 < dVar9));
  uVar1 = result->_timeTotal;
  auVar123._8_4_ = (int)(uVar1 >> 0x20);
  auVar123._0_8_ = uVar1;
  auVar123._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar124._8_4_ = (int)(lVar6 >> 0x23);
  auVar124._0_8_ = lVar7;
  auVar124._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar125._8_4_ = (int)(sVar3 >> 0x20);
  auVar125._0_8_ = sVar3;
  auVar125._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (((((auVar123._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                        ((auVar124._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) /
                       ((auVar125._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) / 1000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," %",2);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pCVar4 = local_40;
  poVar5 = local_40->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Median time: ",0xd);
  auVar126._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar126._8_4_ = (int)(result->_iterations >> 0x20);
  auVar126._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     ((result->_timeMedian /
                      ((auVar126._8_8_ - 1.9342813113834067e+25) +
                      (auVar126._0_8_ - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," us (",5);
  local_60[0] = TextCyan;
  poVar5 = operator<<(poVar5,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"1st quartile: ",0xe);
  auVar127._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar127._8_4_ = (int)(result->_iterations >> 0x20);
  auVar127._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     ((result->_timeQuartile1 /
                      ((auVar127._8_8_ - 1.9342813113834067e+25) +
                      (auVar127._0_8_ - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," us | 3rd quartile: ",0x14);
  auVar128._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar128._8_4_ = (int)(result->_iterations >> 0x20);
  auVar128._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     ((result->_timeQuartile3 /
                      ((auVar128._8_8_ - 1.9342813113834067e+25) +
                      (auVar128._0_8_ - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," us",3);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = pCVar4->_stream;
  lVar6 = *(long *)poVar5;
  *(undefined8 *)(poVar5 + *(long *)(lVar6 + -0x18) + 8) = 5;
  *(undefined8 *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"",0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = pCVar4->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Average performance: ",0x15);
  uVar1 = result->_timeTotal;
  auVar42._8_4_ = (int)(uVar1 >> 0x20);
  auVar42._0_8_ = uVar1;
  auVar42._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar43._8_4_ = (int)(lVar6 >> 0x23);
  auVar43._0_8_ = lVar7;
  auVar43._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar44._8_4_ = (int)(sVar3 >> 0x20);
  auVar44._0_8_ = sVar3;
  auVar44._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      ((((auVar42._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar43._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) /
                      ((auVar44._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," iterations/s",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar1 = result->_timeRunMin;
  auVar45._8_4_ = (int)(uVar1 >> 0x20);
  auVar45._0_8_ = uVar1;
  auVar45._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar165._8_4_ = (int)(sVar3 >> 0x20);
  auVar165._0_8_ = sVar3;
  auVar165._12_4_ = 0x45300000;
  dVar9 = (auVar165._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  uVar2 = result->_timeTotal;
  auVar129._8_4_ = (int)(uVar2 >> 0x20);
  auVar129._0_8_ = uVar2;
  auVar129._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar130._8_4_ = (int)(lVar6 >> 0x23);
  auVar130._0_8_ = lVar7;
  auVar130._12_4_ = 0x45300000;
  local_58 = (TestParametersDescriptor *)
             (1000000000.0 /
              (((auVar45._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar9) -
             1000000000.0 /
             ((((auVar129._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
              ((auVar130._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9));
  poVar5 = pCVar4->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Best performance: ",0x12);
  uVar1 = result->_timeRunMin;
  auVar46._8_4_ = (int)(uVar1 >> 0x20);
  auVar46._0_8_ = uVar1;
  auVar46._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar47._8_4_ = (int)(sVar3 >> 0x20);
  auVar47._0_8_ = sVar3;
  auVar47._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (((auVar46._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar47._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"iterations/s",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  uVar1 = result->_timeRunMin;
  auVar48._8_4_ = (int)(uVar1 >> 0x20);
  auVar48._0_8_ = uVar1;
  auVar48._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar166._8_4_ = (int)(sVar3 >> 0x20);
  auVar166._0_8_ = sVar3;
  auVar166._12_4_ = 0x45300000;
  dVar9 = (auVar166._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  uVar2 = result->_timeTotal;
  auVar131._8_4_ = (int)(uVar2 >> 0x20);
  auVar131._0_8_ = uVar2;
  auVar131._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar132._8_4_ = (int)(lVar6 >> 0x23);
  auVar132._0_8_ = lVar7;
  auVar132._12_4_ = 0x45300000;
  local_60[0] = (uint)(1000000000.0 /
                       (((auVar48._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar9) <
                      1000000000.0 /
                      ((((auVar131._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                       ((auVar132._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9)) *
                2 + TextGreen;
  poVar5 = operator<<(poVar5,local_60);
  uVar1 = result->_timeRunMin;
  auVar49._8_4_ = (int)(uVar1 >> 0x20);
  auVar49._0_8_ = uVar1;
  auVar49._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar167._8_4_ = (int)(sVar3 >> 0x20);
  auVar167._0_8_ = sVar3;
  auVar167._12_4_ = 0x45300000;
  dVar9 = (auVar167._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  dVar146 = 1000000000.0 /
            (((auVar49._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar9);
  uVar1 = result->_timeTotal;
  auVar133._8_4_ = (int)(uVar1 >> 0x20);
  auVar133._0_8_ = uVar1;
  auVar133._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar134._8_4_ = (int)(lVar6 >> 0x23);
  auVar134._0_8_ = lVar7;
  auVar134._12_4_ = 0x45300000;
  dVar9 = 1000000000.0 /
          ((((auVar133._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
           ((auVar134._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9);
  pcVar8 = "";
  if (dVar9 < dVar146) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar9 < dVar146));
  poVar5 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"iterations/s",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
  uVar1 = result->_timeRunMin;
  auVar50._8_4_ = (int)(uVar1 >> 0x20);
  auVar50._0_8_ = uVar1;
  auVar50._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar168._8_4_ = (int)(sVar3 >> 0x20);
  auVar168._0_8_ = sVar3;
  auVar168._12_4_ = 0x45300000;
  dVar9 = (auVar168._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  dVar146 = 1000000000.0 /
            (((auVar50._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar9);
  uVar1 = result->_timeTotal;
  auVar135._8_4_ = (int)(uVar1 >> 0x20);
  auVar135._0_8_ = uVar1;
  auVar135._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar136._8_4_ = (int)(lVar6 >> 0x23);
  auVar136._0_8_ = lVar7;
  auVar136._12_4_ = 0x45300000;
  dVar9 = 1000000000.0 /
          ((((auVar135._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
           ((auVar136._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9);
  pcVar8 = "";
  if (dVar9 < dVar146) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar9 < dVar146));
  uVar1 = result->_timeTotal;
  auVar51._8_4_ = (int)(uVar1 >> 0x20);
  auVar51._0_8_ = uVar1;
  auVar51._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar52._8_4_ = (int)(lVar6 >> 0x23);
  auVar52._0_8_ = lVar7;
  auVar52._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar53._8_4_ = (int)(sVar3 >> 0x20);
  auVar53._0_8_ = sVar3;
  auVar53._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (1000000000.0 /
                      ((((auVar51._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar52._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) /
                      ((auVar53._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," %",2);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar1 = result->_timeRunMax;
  auVar54._8_4_ = (int)(uVar1 >> 0x20);
  auVar54._0_8_ = uVar1;
  auVar54._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar169._8_4_ = (int)(sVar3 >> 0x20);
  auVar169._0_8_ = sVar3;
  auVar169._12_4_ = 0x45300000;
  dVar9 = (auVar169._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  uVar2 = result->_timeTotal;
  auVar137._8_4_ = (int)(uVar2 >> 0x20);
  auVar137._0_8_ = uVar2;
  auVar137._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar138._8_4_ = (int)(lVar6 >> 0x23);
  auVar138._0_8_ = lVar7;
  auVar138._12_4_ = 0x45300000;
  local_58 = (TestParametersDescriptor *)
             (1000000000.0 /
              (((auVar54._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar9) -
             1000000000.0 /
             ((((auVar137._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
              ((auVar138._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9));
  poVar5 = local_40->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Worst performance: ",0x13);
  uVar1 = result->_timeRunMax;
  auVar55._8_4_ = (int)(uVar1 >> 0x20);
  auVar55._0_8_ = uVar1;
  auVar55._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar56._8_4_ = (int)(sVar3 >> 0x20);
  auVar56._0_8_ = sVar3;
  auVar56._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (((auVar55._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar56._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"iterations/s",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  uVar1 = result->_timeRunMax;
  auVar57._8_4_ = (int)(uVar1 >> 0x20);
  auVar57._0_8_ = uVar1;
  auVar57._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar170._8_4_ = (int)(sVar3 >> 0x20);
  auVar170._0_8_ = sVar3;
  auVar170._12_4_ = 0x45300000;
  dVar9 = (auVar170._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  uVar2 = result->_timeTotal;
  auVar139._8_4_ = (int)(uVar2 >> 0x20);
  auVar139._0_8_ = uVar2;
  auVar139._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar140._8_4_ = (int)(lVar6 >> 0x23);
  auVar140._0_8_ = lVar7;
  auVar140._12_4_ = 0x45300000;
  local_60[0] = (uint)(1000000000.0 /
                       (((auVar57._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar9) <
                      1000000000.0 /
                      ((((auVar139._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                       ((auVar140._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9)) *
                2 + TextGreen;
  poVar5 = operator<<(poVar5,local_60);
  uVar1 = result->_timeRunMax;
  auVar58._8_4_ = (int)(uVar1 >> 0x20);
  auVar58._0_8_ = uVar1;
  auVar58._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar171._8_4_ = (int)(sVar3 >> 0x20);
  auVar171._0_8_ = sVar3;
  auVar171._12_4_ = 0x45300000;
  dVar9 = (auVar171._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  dVar146 = 1000000000.0 /
            (((auVar58._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar9);
  uVar1 = result->_timeTotal;
  auVar141._8_4_ = (int)(uVar1 >> 0x20);
  auVar141._0_8_ = uVar1;
  auVar141._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar142._8_4_ = (int)(lVar6 >> 0x23);
  auVar142._0_8_ = lVar7;
  auVar142._12_4_ = 0x45300000;
  dVar9 = 1000000000.0 /
          ((((auVar141._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
           ((auVar142._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9);
  pcVar8 = "";
  if (dVar9 < dVar146) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar9 < dVar146));
  poVar5 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"iterations/s",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
  uVar1 = result->_timeRunMax;
  auVar59._8_4_ = (int)(uVar1 >> 0x20);
  auVar59._0_8_ = uVar1;
  auVar59._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar172._8_4_ = (int)(sVar3 >> 0x20);
  auVar172._0_8_ = sVar3;
  auVar172._12_4_ = 0x45300000;
  dVar9 = (auVar172._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  dVar146 = 1000000000.0 /
            (((auVar59._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar9);
  uVar1 = result->_timeTotal;
  auVar143._8_4_ = (int)(uVar1 >> 0x20);
  auVar143._0_8_ = uVar1;
  auVar143._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar144._8_4_ = (int)(lVar6 >> 0x23);
  auVar144._0_8_ = lVar7;
  auVar144._12_4_ = 0x45300000;
  dVar9 = 1000000000.0 /
          ((((auVar143._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
           ((auVar144._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) / dVar9);
  pcVar8 = "";
  if (dVar9 < dVar146) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)(dVar9 < dVar146));
  uVar1 = result->_timeTotal;
  auVar60._8_4_ = (int)(uVar1 >> 0x20);
  auVar60._0_8_ = uVar1;
  auVar60._12_4_ = 0x45300000;
  lVar6 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar61._8_4_ = (int)(lVar6 >> 0x23);
  auVar61._0_8_ = lVar7;
  auVar61._12_4_ = 0x45300000;
  sVar3 = result->_iterations;
  auVar62._8_4_ = (int)(sVar3 >> 0x20);
  auVar62._0_8_ = sVar3;
  auVar62._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (1000000000.0 /
                      ((((auVar60._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar61._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) /
                      ((auVar62._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," %",2);
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = local_40->_stream;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Median performance: ",0x14);
  auVar63._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar63._8_4_ = (int)(result->_iterations >> 0x20);
  auVar63._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (result->_timeMedian /
                      ((auVar63._8_8_ - 1.9342813113834067e+25) +
                      (auVar63._0_8_ - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," iterations/s (",0xf);
  local_60[0] = TextCyan;
  poVar5 = operator<<(poVar5,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"1st quartile: ",0xe);
  auVar64._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar64._8_4_ = (int)(result->_iterations >> 0x20);
  auVar64._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (result->_timeQuartile1 /
                      ((auVar64._8_8_ - 1.9342813113834067e+25) +
                      (auVar64._0_8_ - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," | 3rd quartile: ",0x11);
  auVar145._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar145._8_4_ = (int)(result->_iterations >> 0x20);
  auVar145._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (result->_timeQuartile3 /
                      ((auVar145._8_8_ - 1.9342813113834067e+25) +
                      (auVar145._0_8_ - 4503599627370496.0))));
  local_60[1] = 0;
  poVar5 = operator<<(poVar5,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

virtual void EndTest(const std::string& fixtureName,
                             const std::string& testName,
                             const TestParametersDescriptor& parameters,
                             const TestResult& result)
        {
#define PAD(x) _stream << std::setw(34) << x << std::endl;
#define PAD_DEVIATION(description,                                      \
                      deviated,                                         \
                      average,                                          \
                      unit)                                             \
            {                                                           \
                double _d_ =                                            \
                    double(deviated) - double(average);                 \
                                                                        \
                PAD(description <<                                      \
                    deviated << " " << unit << " (" <<                  \
                    (deviated < average ?                               \
                     Console::TextRed :                                 \
                     Console::TextGreen) <<                             \
                    (deviated > average ? "+" : "") <<                  \
                    _d_ << " " << unit << " / " <<                      \
                    (deviated > average ? "+" : "") <<                  \
                    (_d_ * 100.0 / average) << " %" <<                  \
                    Console::TextDefault << ")");                       \
            }
#define PAD_DEVIATION_INVERSE(description,                              \
                              deviated,                                 \
                              average,                                  \
                              unit)                                     \
            {                                                           \
                double _d_ =                                            \
                    double(deviated) - double(average);                 \
                                                                        \
                PAD(description <<                                      \
                    deviated << " " << unit << " (" <<                  \
                    (deviated > average ?                               \
                     Console::TextRed :                                 \
                     Console::TextGreen) <<                             \
                    (deviated > average ? "+" : "") <<                  \
                    _d_ << " " << unit << " / " <<                      \
                    (deviated > average ? "+" : "") <<                  \
                    (_d_ * 100.0 / average) << " %" <<                  \
                    Console::TextDefault << ")");                       \
            }

            _stream << Console::TextGreen << "[     DONE ]"
                    << Console::TextYellow << " ";
            WriteTestNameToStream(_stream, fixtureName, testName, parameters);
            _stream << Console::TextDefault << " ("
                    << std::setprecision(6)
                    << (result.TimeTotal() / 1000000.0) << " ms)"
                    << std::endl;

            _stream << Console::TextBlue << "[   RUNS   ] "
                    << Console::TextDefault
                    << "       Average time: "
                    << std::setprecision(3)
                    << result.RunTimeAverage() / 1000.0 << " us "
                    << "(" << Console::TextBlue << "~"
                    << result.RunTimeStdDev() / 1000.0 << " us"
                    << Console::TextDefault << ")"
                    << std::endl;

            PAD_DEVIATION_INVERSE("Fastest time: ",
                                  (result.RunTimeMinimum() / 1000.0),
                                  (result.RunTimeAverage() / 1000.0),
                                  "us");
            PAD_DEVIATION_INVERSE("Slowest time: ",
                                  (result.RunTimeMaximum() / 1000.0),
                                  (result.RunTimeAverage() / 1000.0),
                                  "us");
            PAD("Median time: " <<
                result.RunTimeMedian() / 1000.0 << " us (" <<
                Console::TextCyan << "1st quartile: " <<
                result.RunTimeQuartile1() / 1000.0 << " us | 3rd quartile: " <<
                result.RunTimeQuartile3() / 1000.0 << " us" <<
                Console::TextDefault << ")");

            _stream << std::setprecision(5);

            PAD("");
            PAD("Average performance: " <<
                result.RunsPerSecondAverage() << " runs/s");
            PAD_DEVIATION("Best performance: ",
                          result.RunsPerSecondMaximum(),
                          result.RunsPerSecondAverage(),
                          "runs/s");
            PAD_DEVIATION("Worst performance: ",
                          result.RunsPerSecondMinimum(),
                          result.RunsPerSecondAverage(),
                          "runs/s");
            PAD("Median performance: " <<
                result.RunsPerSecondMedian() << " runs/s (" <<
                Console::TextCyan << "1st quartile: " <<
                result.RunsPerSecondQuartile1() << " | 3rd quartile: " <<
                result.RunsPerSecondQuartile3() <<
                Console::TextDefault << ")");

            PAD("");
            _stream << Console::TextBlue << "[ITERATIONS] "
                    << Console::TextDefault
                    << std::setprecision(3)
                    << "       Average time: "
                    << result.IterationTimeAverage() / 1000.0 << " us "
                    << "(" << Console::TextBlue << "~"
                    << result.IterationTimeStdDev() / 1000.0 << " us"
                    << Console::TextDefault << ")"
                    << std::endl;

            PAD_DEVIATION_INVERSE("Fastest time: ",
                                  (result.IterationTimeMinimum() / 1000.0),
                                  (result.IterationTimeAverage() / 1000.0),
                                  "us");
            PAD_DEVIATION_INVERSE("Slowest time: ",
                                  (result.IterationTimeMaximum() / 1000.0),
                                  (result.IterationTimeAverage() / 1000.0),
                                  "us");
            PAD("Median time: " <<
                result.IterationTimeMedian() / 1000.0 << " us (" <<
                Console::TextCyan << "1st quartile: " <<
                result.IterationTimeQuartile1() / 1000.0 <<
                " us | 3rd quartile: " <<
                result.IterationTimeQuartile3() / 1000.0 << " us" <<
                Console::TextDefault << ")");

            _stream << std::setprecision(5);

            PAD("");
            PAD("Average performance: " <<
                result.IterationsPerSecondAverage() <<
                " iterations/s");
            PAD_DEVIATION("Best performance: ",
                          (result.IterationsPerSecondMaximum()),
                          (result.IterationsPerSecondAverage()),
                          "iterations/s");
            PAD_DEVIATION("Worst performance: ",
                          (result.IterationsPerSecondMinimum()),
                          (result.IterationsPerSecondAverage()),
                          "iterations/s");
            PAD("Median performance: " <<
                result.IterationsPerSecondMedian() << " iterations/s (" <<
                Console::TextCyan << "1st quartile: " <<
                result.IterationsPerSecondQuartile1() <<
                " | 3rd quartile: " <<
                result.IterationsPerSecondQuartile3() <<
                Console::TextDefault << ")");

#undef PAD_DEVIATION_INVERSE
#undef PAD_DEVIATION
#undef PAD
        }